

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::filldata<const_char32_t[1]>::fill(ostream *stream,char32_t (*in) [1])

{
  char32_t (*s) [1];
  String local_38;
  long local_20;
  size_t i;
  char32_t (*in_local) [1];
  ostream *stream_local;
  
  i = (size_t)in;
  in_local = (char32_t (*) [1])stream;
  std::operator<<(stream,"[");
  for (local_20 = 0; s = in_local, local_20 == 0; local_20 = local_20 + 1) {
    toString<char32_t,_true>(&local_38,(char32_t *)i);
    doctest::operator<<((ostream *)s,&local_38);
    String::~String(&local_38);
  }
  std::operator<<((ostream *)in_local,"]");
  return;
}

Assistant:

static void fill(std::ostream* stream, const T(&in)[N]) {
            *stream << "[";
            for (size_t i = 0; i < N; i++) {
                if (i != 0) { *stream << ", "; }
                *stream << (DOCTEST_STRINGIFY(in[i]));
            }
            *stream << "]";
        }